

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O1

void __thiscall summarycalc::dogulitemxsummary(summarycalc *this)

{
  int item_id;
  pointer piVar1;
  int sample_size;
  int event_id;
  int iVar2;
  size_t sVar3;
  OASIS_FLOAT **ppOVar4;
  ostream *poVar5;
  uint uVar6;
  int coverage_or_output_id;
  int i;
  long lVar7;
  int i_1;
  gulSampleslevelRec gr;
  uint samplesize;
  gulSampleslevelHeader gh;
  uint streamtype;
  int local_48;
  OASIS_FLOAT local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  
  loadcoverages(this);
  loaditemtocoverage(this);
  loadgulsummaryxref(this);
  lVar7 = 0;
  do {
    if (this->fout[lVar7] != (FILE *)0x0) {
      outputstreamtype(this,(int)lVar7);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  local_34 = 0;
  fread(&local_34,4,1,_stdin);
  if ((local_34 >> 0x18 & 1) == 0) {
    return;
  }
  uVar6 = local_34 & 0xffffff;
  local_40 = 0;
  if (uVar6 != 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"summarycalc: Unexpected Gul stream type ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
    std::operator<<(poVar5," expecting gulitem stream\n");
    exit(-1);
  }
  sVar3 = fread(&local_40,4,1,_stdin);
  sample_size = local_40;
  lVar7 = 0;
  do {
    if (this->fout[lVar7] != (FILE *)0x0) {
      ppOVar4 = alloc_ssl_arrays(this,(int)lVar7,sample_size);
      this->sssl[lVar7] = ppOVar4;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  lVar7 = 0;
  do {
    if (this->fout[lVar7] != (FILE *)0x0) {
      reset_ssl_array(this,(int)lVar7,sample_size,this->sssl[lVar7]);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  alloc_sse_array(this);
  reset_sse_array(this);
  lVar7 = 0;
  do {
    if (this->fout[lVar7] != (FILE *)0x0) {
      outputsamplesizeandsummaryset(this,(int)lVar7,sample_size);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  iVar2 = (int)sVar3;
  do {
    if (iVar2 != 1) {
      return;
    }
    sVar3 = fread(&local_3c,8,1,_stdin);
    if ((int)sVar3 == 0) {
      return;
    }
    piVar1 = (this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    item_id = piVar1[local_38];
    coverage_or_output_id = item_id;
    if ((this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar1) {
      coverage_or_output_id = piVar1[item_id];
    }
    sVar3 = fread(&local_48,8,1,_stdin);
    event_id = local_3c;
    iVar2 = (int)sVar3;
    if (iVar2 == 0) {
      return;
    }
    do {
      if (local_48 == 0) break;
      dosummary(this,sample_size,event_id,item_id,coverage_or_output_id,local_48,local_44,
                (this->coverages_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[item_id]);
      sVar3 = fread(&local_48,8,1,_stdin);
      iVar2 = (int)sVar3;
    } while (iVar2 != 0);
  } while( true );
}

Assistant:

void summarycalc::dogulitemxsummary()
{
	loadcoverages();
	loaditemtocoverage();
	loadgulsummaryxref();
	outputstreamtype();
	unsigned int streamtype = 0;
	int i = (int) fread(&streamtype, sizeof(streamtype), 1, stdin);
	if (isGulStream(streamtype) == true) {
		int stream_type = streamtype & streamno_mask;
		unsigned int samplesize = 0;
		if (stream_type == 1) {
			i = (int) fread(&samplesize, sizeof(samplesize), 1, stdin);
			alloc_sssl_array(samplesize);
			reset_sssl_array(samplesize);
			alloc_sse_array();
			reset_sse_array();
			outputsamplesize(samplesize);
			gulSampleslevelHeader gh;
			bool havedata = false;
			while (i == 1) {
				i = (int)fread(&gh, sizeof(gh), 1, stdin);
				if (i > 0 && havedata == false) havedata = true;
				if (i == 0) break;
				int coverage_id = item_to_coverage_[gh.item_id];
				int cov_id = getcovid(coverage_id);
				while (i != 0) {
					gulSampleslevelRec gr;
					i = (int) fread(&gr, sizeof(gr), 1, stdin);
					if (i == 0) break;
					if (gr.sidx == 0) break;
					dosummary(samplesize, gh.event_id,
						  coverage_id, cov_id, gr.sidx,
						  gr.loss,
						  coverages_[coverage_id]);
				}
			}
			return;
		}
		std::cerr << "summarycalc: Unexpected Gul stream type " << stream_type << " expecting gulitem stream\n";
		::exit(-1);
	}
}